

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evolution-test.c++
# Opt level: O1

ChangeInfo *
capnp::compiler::anon_unknown_0::fieldChangeType
          (ChangeInfo *__return_storage_ptr__,Builder decl,uint *nextOrdinal,bool scopeHasUnion)

{
  WirePointer WVar1;
  uint uVar2;
  int iVar3;
  size_t sVar4;
  char *pcVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  Reader RVar8;
  Reader value;
  Builder name;
  Builder dval;
  StructBuilder local_f0;
  ListElementCount local_c8;
  StructBuilder local_c0;
  StructBuilder local_98;
  PointerBuilder local_68;
  ListBuilder local_50;
  
  if (*(short *)((long)decl._builder.data + 0xc) == 0) {
    local_f0.data = decl._builder.pointers + 5;
    local_f0.segment = decl._builder.segment;
    local_f0.capTable = decl._builder.capTable;
    capnp::_::PointerBuilder::getStruct
              (&local_98,(PointerBuilder *)&local_f0,(StructSize)0x20003,(word *)0x0);
    if ((short)((WireValue<uint32_t> *)local_98.data)->value == 9) {
      do {
        uVar2 = rand();
        if ((uVar2 & 1) == 0) {
          *(undefined2 *)&((WireValue<uint32_t> *)local_98.data)->value = 5;
          local_c0.segment = local_98.segment;
          local_c0.capTable = local_98.capTable;
          local_c0.data = local_98.pointers;
          capnp::_::PointerBuilder::initStruct
                    (&local_f0,(PointerBuilder *)&local_c0,(StructSize)0x10001);
        }
        else {
          local_f0.data = local_98.pointers + 1;
          local_f0.segment = local_98.segment;
          local_f0.capTable = local_98.capTable;
          capnp::_::PointerBuilder::getStructList
                    (&local_50,(PointerBuilder *)&local_f0,(StructSize)0x20001,(word *)0x0);
          capnp::_::ListBuilder::getStructElement(&local_c0,&local_50,0);
          local_68.pointer = local_c0.pointers + 1;
          local_68.segment = local_c0.segment;
          local_68.capTable = local_c0.capTable;
          capnp::_::PointerBuilder::getStruct(&local_f0,&local_68,(StructSize)0x20003,(word *)0x0);
          local_98.segment = local_f0.segment;
          local_98.capTable = local_f0.capTable;
          local_98.data = local_f0.data;
          local_98.pointers = local_f0.pointers;
        }
      } while ((short)((WireValue<uint32_t> *)local_98.data)->value == 9);
    }
    local_f0.segment = local_98.segment;
    local_f0.capTable = local_98.capTable;
    local_f0.data = local_98.pointers;
    capnp::_::PointerBuilder::getStruct
              (&local_c0,(PointerBuilder *)&local_f0,(StructSize)0x10001,(word *)0x0);
    capnp::_::StructBuilder::asReader(&local_c0);
    local_50.segment = local_f0.segment;
    local_50.capTable = local_f0.capTable;
    if (local_f0.pointerCount == 0) {
      local_c8 = 0x7fffffff;
      local_f0.pointers = (WirePointer *)0x0;
      local_50.segment = (SegmentBuilder *)0x0;
      local_50.capTable = (CapTableBuilder *)0x0;
    }
    local_50.ptr = (byte *)local_f0.pointers;
    local_50.elementCount = local_c8;
    RVar8 = capnp::_::PointerReader::getBlob<capnp::Text>((PointerReader *)&local_50,(void *)0x0,0);
    if ((RVar8.super_StringPtr.content.size_ - 1 < 4) ||
       (*RVar8.super_StringPtr.content.ptr != 0x74786554)) {
      pcVar5 = "Text";
      sVar4 = 5;
    }
    else {
      pcVar5 = "Int32";
      sVar4 = 6;
    }
    local_f0.capTable = local_c0.capTable;
    local_f0.segment = local_c0.segment;
    RVar8.super_StringPtr.content.size_ = sVar4;
    RVar8.super_StringPtr.content.ptr = pcVar5;
    capnp::_::PointerBuilder::setBlob<capnp::Text>((PointerBuilder *)&local_f0,RVar8);
    __return_storage_ptr__->kind = INCOMPATIBLE;
    kj::heapString(&__return_storage_ptr__->description,0x1b);
    pcVar5 = (char *)(__return_storage_ptr__->description).content.size_;
    if (pcVar5 != (char *)0x0) {
      pcVar5 = (__return_storage_ptr__->description).content.ptr;
    }
    builtin_strncpy(pcVar5 + 0xb,"type of a field.",0x10);
    uVar6._0_1_ = 'h';
    uVar6._1_1_ = 'e';
    uVar6._2_1_ = ' ';
    uVar6._3_1_ = 't';
    uVar7._0_1_ = 'y';
    uVar7._1_1_ = 'p';
    uVar7._2_1_ = 'e';
    uVar7._3_1_ = ' ';
    goto LAB_0010e7ba;
  }
  local_f0.data = decl._builder.pointers + 6;
  local_f0.segment = decl._builder.segment;
  local_f0.capTable = decl._builder.capTable;
  capnp::_::PointerBuilder::getStruct
            (&local_98,(PointerBuilder *)&local_f0,(StructSize)0x20003,(word *)0x0);
  switch((short)((WireValue<uint32_t> *)local_98.data)->value) {
  case 0:
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[26]>
              ((Fault *)&local_f0,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compiler/evolution-test.c++"
               ,0x19a,FAILED,(char *)0x0,"\"unknown value expression?\"",
               (char (*) [26])"unknown value expression?");
    kj::_::Debug::Fault::fatal((Fault *)&local_f0);
  case 1:
    *(undefined2 *)&((WireValue<uint32_t> *)local_98.data)->value = 1;
    goto LAB_0010e63c;
  case 2:
    *(undefined2 *)&((WireValue<uint32_t> *)local_98.data)->value = 2;
LAB_0010e63c:
    *(byte *)&(((WirePointer *)((long)local_98.data + 8))->offsetAndKind).value =
         (byte)(((WirePointer *)((long)local_98.data + 8))->offsetAndKind).value ^ 1;
    break;
  case 3:
    WVar1 = *(WirePointer *)((long)local_98.data + 8);
    *(undefined2 *)&((WireValue<uint32_t> *)local_98.data)->value = 3;
    *(ulong *)((long)local_98.data + 8) = (ulong)WVar1 ^ 0x8000000000000000;
    break;
  case 4:
  case 6:
  case 7:
  case 8:
    __return_storage_ptr__->kind = NO_CHANGE;
    kj::heapString(&__return_storage_ptr__->description,0x3e);
    pcVar5 = (char *)(__return_storage_ptr__->description).content.size_;
    if (pcVar5 != (char *)0x0) {
      pcVar5 = (__return_storage_ptr__->description).content.ptr;
    }
    builtin_strncpy(pcVar5 + 0x10,"lt value of a field, but it\'s a pointer field.",0x2e);
    uVar6._0_1_ = 'h';
    uVar6._1_1_ = 'e';
    uVar6._2_1_ = ' ';
    uVar6._3_1_ = 'd';
    uVar7._0_1_ = 'e';
    uVar7._1_1_ = 'f';
    uVar7._2_1_ = 'a';
    uVar7._3_1_ = 'u';
    goto LAB_0010e7ba;
  case 5:
    local_f0.segment = local_98.segment;
    local_f0.capTable = local_98.capTable;
    local_f0.data = local_98.pointers;
    capnp::_::PointerBuilder::getStruct
              (&local_c0,(PointerBuilder *)&local_f0,(StructSize)0x10001,(word *)0x0);
    capnp::_::StructBuilder::asReader(&local_c0);
    local_50.segment = local_f0.segment;
    local_50.capTable = local_f0.capTable;
    if (local_f0.pointerCount == 0) {
      local_c8 = 0x7fffffff;
      local_f0.pointers = (WirePointer *)0x0;
      local_50.segment = (SegmentBuilder *)0x0;
      local_50.capTable = (CapTableBuilder *)0x0;
    }
    local_50.ptr = (byte *)local_f0.pointers;
    local_50.elementCount = local_c8;
    RVar8 = capnp::_::PointerReader::getBlob<capnp::Text>((PointerReader *)&local_50,(void *)0x0,0);
    sVar4 = RVar8.super_StringPtr.content.size_;
    pcVar5 = RVar8.super_StringPtr.content.ptr;
    if (sVar4 == 4) {
      iVar3 = bcmp(pcVar5,"foo",4);
      if (iVar3 != 0) goto LAB_0010e755;
      local_f0.segment = local_c0.segment;
      local_f0.capTable = local_c0.capTable;
      local_f0.data = local_c0.pointers;
      pcVar5 = "bar";
LAB_0010e772:
      sVar4 = 4;
    }
    else if (sVar4 == 6) {
      iVar3 = bcmp(pcVar5,"false",6);
      if (iVar3 != 0) {
LAB_0010e755:
        local_f0.segment = local_c0.segment;
        local_f0.capTable = local_c0.capTable;
        local_f0.data = local_c0.pointers;
        pcVar5 = "foo";
        goto LAB_0010e772;
      }
      local_f0.segment = local_c0.segment;
      local_f0.capTable = local_c0.capTable;
      local_f0.data = local_c0.pointers;
      pcVar5 = "true";
      sVar4 = 5;
    }
    else {
      if ((sVar4 != 5) || (iVar3 = bcmp(pcVar5,"true",5), iVar3 != 0)) goto LAB_0010e755;
      local_f0.segment = local_c0.segment;
      local_f0.capTable = local_c0.capTable;
      local_f0.data = local_c0.pointers;
      pcVar5 = "false";
      sVar4 = 6;
    }
    value.super_StringPtr.content.size_ = sVar4;
    value.super_StringPtr.content.ptr = pcVar5;
    capnp::_::PointerBuilder::setBlob<capnp::Text>((PointerBuilder *)&local_f0,value);
    break;
  case 9:
  case 10:
  case 0xb:
  case 0xc:
  case 0xd:
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[28]>
              ((Fault *)&local_f0,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compiler/evolution-test.c++"
               ,0x1b7,FAILED,(char *)0x0,"\"Unexpected expression type.\"",
               (char (*) [28])"Unexpected expression type.");
    kj::_::Debug::Fault::fatal((Fault *)&local_f0);
  }
  __return_storage_ptr__->kind = INCOMPATIBLE;
  kj::heapString(&__return_storage_ptr__->description,0x2e);
  pcVar5 = (char *)(__return_storage_ptr__->description).content.size_;
  if (pcVar5 != (char *)0x0) {
    pcVar5 = (__return_storage_ptr__->description).content.ptr;
  }
  builtin_strncpy(pcVar5 + 0x10,"lt value of a pritimive field.",0x1e);
  uVar6._0_1_ = 'h';
  uVar6._1_1_ = 'e';
  uVar6._2_1_ = ' ';
  uVar6._3_1_ = 'd';
  uVar7._0_1_ = 'e';
  uVar7._1_1_ = 'f';
  uVar7._2_1_ = 'a';
  uVar7._3_1_ = 'u';
LAB_0010e7ba:
  pcVar5[0] = 'C';
  pcVar5[1] = 'h';
  pcVar5[2] = 'a';
  pcVar5[3] = 'n';
  pcVar5[4] = 'g';
  pcVar5[5] = 'e';
  pcVar5[6] = ' ';
  pcVar5[7] = 't';
  *(undefined4 *)(pcVar5 + 8) = uVar6;
  *(undefined4 *)(pcVar5 + 0xc) = uVar7;
  return __return_storage_ptr__;
}

Assistant:

static ChangeInfo fieldChangeType(Declaration::Builder decl, uint& nextOrdinal,
                                  bool scopeHasUnion) {
  auto field = decl.getField();

  if (field.getDefaultValue().isNone()) {
    // Change the type.
    auto type = field.getType();
    while (type.isApplication()) {
      // Either change the list parameter, or revert to a non-list.
      if (rand() % 2) {
        type = type.getApplication().getParams()[0].getValue();
      } else {
        type.initRelativeName();
      }
    }
    auto typeName = type.getRelativeName();
    if (typeName.asReader().getValue().startsWith("Text")) {
      typeName.setValue("Int32");
    } else {
      typeName.setValue("Text");
    }
    return { INCOMPATIBLE, "Change the type of a field." };
  } else {
    // Change the default value.
    auto dval = field.getDefaultValue().getValue();
    switch (dval.which()) {
      case Expression::UNKNOWN: KJ_FAIL_ASSERT("unknown value expression?");
      case Expression::POSITIVE_INT: dval.setPositiveInt(dval.getPositiveInt() ^ 1); break;
      case Expression::NEGATIVE_INT: dval.setNegativeInt(dval.getNegativeInt() ^ 1); break;
      case Expression::FLOAT: dval.setFloat(-dval.getFloat()); break;
      case Expression::RELATIVE_NAME: {
        auto name = dval.getRelativeName();
        auto nameText = name.asReader().getValue();
        if (nameText == "true") {
          name.setValue("false");
        } else if (nameText == "false") {
          name.setValue("true");
        } else if (nameText == "foo") {
          name.setValue("bar");
        } else {
          name.setValue("foo");
        }
        break;
      }
      case Expression::STRING:
      case Expression::BINARY:
      case Expression::LIST:
      case Expression::TUPLE:
        return { NO_CHANGE, "Change the default value of a field, but it's a pointer field." };

      case Expression::ABSOLUTE_NAME:
      case Expression::IMPORT:
      case Expression::EMBED:
      case Expression::APPLICATION:
      case Expression::MEMBER:
        KJ_FAIL_ASSERT("Unexpected expression type.");
    }
    return { INCOMPATIBLE, "Change the default value of a pritimive field." };
  }
}